

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

int Abc_NodeBuildCutLevelOne_int
              (Vec_Ptr_t *vVisited,Vec_Ptr_t *vLeaves,int nSizeLimit,int nFaninLimit)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_4c;
  int i;
  int CostCur;
  int CostBest;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pFaninBest;
  Abc_Obj_t *pNode;
  int nFaninLimit_local;
  int nSizeLimit_local;
  Vec_Ptr_t *vLeaves_local;
  Vec_Ptr_t *vVisited_local;
  
  i = 100;
  pNext = (Abc_Obj_t *)0x0;
  for (local_4c = 0; iVar1 = Vec_PtrSize(vLeaves), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,local_4c);
    iVar1 = Abc_NodeGetLeafCostOne(pAVar2,nFaninLimit);
    if ((iVar1 < i) ||
       ((i == iVar1 && (*(uint *)&pNext->field_0x14 >> 0xc < *(uint *)&pAVar2->field_0x14 >> 0xc))))
    {
      i = iVar1;
      pNext = pAVar2;
    }
    if (i == 0) break;
  }
  if (pNext == (Abc_Obj_t *)0x0) {
    vVisited_local._4_4_ = 0;
  }
  else {
    if (2 < i) {
      __assert_fail("CostBest < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcReconv.c"
                    ,0x159,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
    }
    if (nSizeLimit < vLeaves->nSize + -1 + i) {
      vVisited_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_ObjIsNode(pNext);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pFaninBest)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcReconv.c"
                      ,0x15e,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)")
        ;
      }
      Vec_PtrRemove(vLeaves,pNext);
      pAVar2 = Abc_ObjFanin0(pNext);
      if ((*(uint *)&pAVar2->field_0x14 >> 5 & 1) == 0) {
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffdf | 0x20;
        Vec_PtrPush(vLeaves,pAVar2);
        Vec_PtrPush(vVisited,pAVar2);
      }
      pAVar2 = Abc_ObjFanin1(pNext);
      if ((*(uint *)&pAVar2->field_0x14 >> 5 & 1) == 0) {
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffdf | 0x20;
        Vec_PtrPush(vLeaves,pAVar2);
        Vec_PtrPush(vVisited,pAVar2);
      }
      if (nSizeLimit < vLeaves->nSize) {
        __assert_fail("vLeaves->nSize <= nSizeLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcReconv.c"
                      ,0x175,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)")
        ;
      }
      vVisited_local._4_4_ = 1;
    }
  }
  return vVisited_local._4_4_;
}

Assistant:

int Abc_NodeBuildCutLevelOne_int( Vec_Ptr_t * vVisited, Vec_Ptr_t * vLeaves, int nSizeLimit, int nFaninLimit )
{
    Abc_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        CostCur = Abc_NodeGetLeafCostOne( pNode, nFaninLimit );
//printf( "    Fanin %s has cost %d.\n", Abc_ObjName(pNode), CostCur );
//        if ( CostBest > CostCur ) // performance improvement: expand the variable with the smallest level
        if ( CostBest > CostCur ||
             (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( CostBest < 3 );
    if ( vLeaves->nSize - 1 + CostBest > nSizeLimit )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( Abc_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vLeaves, pFaninBest );
//printf( "Removing fanin %s.\n", Abc_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Abc_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Abc_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( vLeaves->nSize <= nSizeLimit );
    // keep doing this
    return 1;
}